

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printValueTree(FILE *fout,Value *value,string *path)

{
  double dVar1;
  bool bVar2;
  ValueType VVar3;
  ArrayIndex AVar4;
  Json *pJVar5;
  long lVar6;
  Value *pVVar7;
  LargestUInt value_00;
  LargestInt value_01;
  pointer pcVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint index;
  string s;
  char buffer_1 [32];
  string exponent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string normalized;
  
  bVar2 = Json::Value::hasComment(value,commentBefore);
  if (bVar2) {
    Json::Value::getComment_abi_cxx11_((string *)buffer_1,value,commentBefore);
    fprintf((FILE *)fout,"%s\n",buffer_1._0_8_);
    std::__cxx11::string::~string((string *)buffer_1);
  }
  VVar3 = Json::Value::type(value);
  switch(VVar3) {
  case nullValue:
    fprintf((FILE *)fout,"%s=null\n",(path->_M_dataplus)._M_p);
    break;
  case intValue:
    pcVar8 = (path->_M_dataplus)._M_p;
    pJVar5 = (Json *)Json::Value::asLargestInt(value);
    Json::valueToString_abi_cxx11_((string *)buffer_1,pJVar5,value_01);
    goto LAB_001142f2;
  case uintValue:
    pcVar8 = (path->_M_dataplus)._M_p;
    pJVar5 = (Json *)Json::Value::asLargestUInt(value);
    Json::valueToString_abi_cxx11_((string *)buffer_1,pJVar5,value_00);
LAB_001142f2:
    pcVar9 = "%s=%s\n";
LAB_001142fc:
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_1;
    fprintf((FILE *)fout,pcVar9,pcVar8,buffer_1._0_8_);
LAB_00114481:
    std::__cxx11::string::~string((string *)this);
    break;
  case realValue:
    pcVar8 = (path->_M_dataplus)._M_p;
    dVar1 = Json::Value::asDouble(value);
    snprintf(buffer_1,0x20,"%.16g",SUB84(dVar1,0));
    buffer_1[0x1f] = '\0';
    std::__cxx11::string::string((string *)&s,buffer_1,(allocator *)&normalized);
    lVar6 = std::__cxx11::string::find_last_of((char *)&s,0x1241fd);
    if (lVar6 == -1) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)s._M_dataplus._M_p == &s.field_2) {
        local_70.field_2._8_8_ = s.field_2._8_8_;
      }
      else {
        local_70._M_dataplus._M_p = s._M_dataplus._M_p;
      }
      local_70._M_string_length = s._M_string_length;
      s._M_string_length = 0;
      s.field_2._M_local_buf[0] = '\0';
      s._M_dataplus._M_p = (pointer)&s.field_2;
    }
    else {
      std::__cxx11::string::substr((ulong)&normalized,(ulong)&s);
      lVar6 = std::__cxx11::string::find_first_not_of((char)&s,0x30);
      std::__cxx11::string::string((string *)&exponent,"0",(allocator *)&local_70);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&s);
        std::__cxx11::string::operator=((string *)&exponent,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::operator+(&local_70,&normalized,&exponent);
      std::__cxx11::string::~string((string *)&exponent);
      std::__cxx11::string::~string((string *)&normalized);
    }
    std::__cxx11::string::~string((string *)&s);
    this = &local_70;
    fprintf((FILE *)fout,"%s=%s\n",pcVar8,local_70._M_dataplus._M_p);
    goto LAB_00114481;
  case stringValue:
    pcVar8 = (path->_M_dataplus)._M_p;
    Json::Value::asString_abi_cxx11_((string *)buffer_1,value);
    pcVar9 = "%s=\"%s\"\n";
    goto LAB_001142fc;
  case booleanValue:
    pcVar8 = (path->_M_dataplus)._M_p;
    bVar2 = Json::Value::asBool(value);
    pcVar9 = "false";
    if (bVar2) {
      pcVar9 = "true";
    }
    fprintf((FILE *)fout,"%s=%s\n",pcVar8,pcVar9);
    break;
  case arrayValue:
    fprintf((FILE *)fout,"%s=[]\n",(path->_M_dataplus)._M_p);
    AVar4 = Json::Value::size(value);
    if ((int)AVar4 < 1) {
      AVar4 = 0;
    }
    for (index = 0; AVar4 != index; index = index + 1) {
      snprintf(printValueTree::buffer,0x10,"[%d]",(ulong)index);
      pVVar7 = Json::Value::operator[](value,index);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_1,
                     path,printValueTree::buffer);
      printValueTree(fout,pVVar7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_1);
      std::__cxx11::string::~string((string *)buffer_1);
    }
    break;
  case objectValue:
    fprintf((FILE *)fout,"%s={}\n",(path->_M_dataplus)._M_p);
    Json::Value::getMemberNames_abi_cxx11_((Members *)&exponent,value);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (exponent._M_dataplus._M_p,exponent._M_string_length);
    pcVar9 = ".";
    if ((path->_M_dataplus)._M_p[path->_M_string_length - 1] == '.') {
      pcVar9 = "";
    }
    std::__cxx11::string::string((string *)buffer_1,pcVar9,(allocator *)&s);
    for (; exponent._M_dataplus._M_p != (pointer)exponent._M_string_length;
        exponent._M_dataplus._M_p = exponent._M_dataplus._M_p + 0x20) {
      pVVar7 = Json::Value::operator[](value,(string *)exponent._M_dataplus._M_p);
      std::operator+(&normalized,path,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_1);
      std::operator+(&s,&normalized,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     exponent._M_dataplus._M_p);
      printValueTree(fout,pVVar7,&s);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)&normalized);
    }
    std::__cxx11::string::~string((string *)buffer_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&exponent);
  }
  bVar2 = Json::Value::hasComment(value,commentAfter);
  if (bVar2) {
    Json::Value::getComment_abi_cxx11_((string *)buffer_1,value,commentAfter);
    fprintf((FILE *)fout,"%s\n",buffer_1._0_8_);
    std::__cxx11::string::~string((string *)buffer_1);
  }
  return;
}

Assistant:

static void
printValueTree(FILE* fout, Json::Value& value, const std::string& path = ".") {
  if (value.hasComment(Json::commentBefore)) {
    fprintf(fout, "%s\n", value.getComment(Json::commentBefore).c_str());
  }
  switch (value.type()) {
  case Json::nullValue:
    fprintf(fout, "%s=null\n", path.c_str());
    break;
  case Json::intValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            Json::valueToString(value.asLargestInt()).c_str());
    break;
  case Json::uintValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            Json::valueToString(value.asLargestUInt()).c_str());
    break;
  case Json::realValue:
    fprintf(fout,
            "%s=%s\n",
            path.c_str(),
            normalizeFloatingPointStr(value.asDouble()).c_str());
    break;
  case Json::stringValue:
    fprintf(fout, "%s=\"%s\"\n", path.c_str(), value.asString().c_str());
    break;
  case Json::booleanValue:
    fprintf(fout, "%s=%s\n", path.c_str(), value.asBool() ? "true" : "false");
    break;
  case Json::arrayValue: {
    fprintf(fout, "%s=[]\n", path.c_str());
    int size = value.size();
    for (int index = 0; index < size; ++index) {
      static char buffer[16];
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__)
      sprintf_s(buffer, sizeof(buffer), "[%d]", index);
#else
      snprintf(buffer, sizeof(buffer), "[%d]", index);
#endif
      printValueTree(fout, value[index], path + buffer);
    }
  } break;
  case Json::objectValue: {
    fprintf(fout, "%s={}\n", path.c_str());
    Json::Value::Members members(value.getMemberNames());
    std::sort(members.begin(), members.end());
    std::string suffix = *(path.end() - 1) == '.' ? "" : ".";
    for (Json::Value::Members::iterator it = members.begin();
         it != members.end();
         ++it) {
      const std::string& name = *it;
      printValueTree(fout, value[name], path + suffix + name);
    }
  } break;
  default:
    break;
  }

  if (value.hasComment(Json::commentAfter)) {
    fprintf(fout, "%s\n", value.getComment(Json::commentAfter).c_str());
  }
}